

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

void nn_global_term(void)

{
  _func_void *p_Var1;
  nn_transport **ppnVar2;
  
  if (self.socks == (nn_sock **)0x0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self.socks",
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/core/global.c"
            ,0x114);
    fflush(_stderr);
    nn_err_abort();
  }
  if (self.nsocks != 0) {
    return;
  }
  nn_pool_term(&self.pool);
  for (ppnVar2 = nn_transports; *ppnVar2 != (nn_transport *)0x0; ppnVar2 = ppnVar2 + 1) {
    p_Var1 = (*ppnVar2)->term;
    if (p_Var1 != (_func_void *)0x0) {
      (*p_Var1)();
    }
  }
  nn_free(self.socks);
  self.socks = (nn_sock **)0x0;
  nn_alloc_term();
  return;
}

Assistant:

static void nn_global_term (void)
{
#if defined NN_HAVE_WINDOWS
    int rc;
#endif
    const struct nn_transport *tp;
    int i;

    /*  If there are no sockets remaining, uninitialise the global context. */
    nn_assert (self.socks);
    if (self.nsocks > 0)
        return;

    /*  Shut down the worker threads. */
    nn_pool_term (&self.pool);

    /*  Ask all the transport to deallocate their global resources. */
    for (i = 0; (tp = nn_transports[i]) != NULL; i++) {
        if (tp->term)
            tp->term ();
    }

    /*  Final deallocation of the nn_global object itself. */
    nn_free (self.socks);

    /*  This marks the global state as uninitialised. */
    self.socks = NULL;

    /*  Shut down the memory allocation subsystem. */
    nn_alloc_term ();

    /*  On Windows, uninitialise the socket library. */
#if defined NN_HAVE_WINDOWS
    rc = WSACleanup ();
    nn_assert (rc == 0);
#endif
}